

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_dns_encode_record
              (mbuf *io,mg_dns_resource_record *rr,char *name,size_t nlen,void *rdata,size_t rlen)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  size_t off;
  int iVar4;
  int iVar5;
  uint16_t u16;
  uint32_t u32;
  ushort local_42;
  char *local_40;
  uint local_34;
  
  iVar5 = -1;
  if (rr->kind != MG_DNS_INVALID_RECORD) {
    sVar3 = io->len;
    iVar4 = mg_dns_encode_name(io,name,nlen);
    if (iVar4 != -1) {
      uVar1 = (ushort)rr->rtype;
      local_42 = uVar1 << 8 | uVar1 >> 8;
      local_40 = (char *)rdata;
      mbuf_insert(io,io->len,&local_42,2);
      uVar1 = (ushort)rr->rclass;
      local_42 = uVar1 << 8 | uVar1 >> 8;
      mbuf_insert(io,io->len,&local_42,2);
      if (rr->kind == MG_DNS_ANSWER) {
        uVar2 = rr->ttl;
        local_34 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        mbuf_insert(io,io->len,&local_34,4);
        if (rr->rtype == 5) {
          off = io->len;
          mbuf_insert(io,off,&local_42,2);
          iVar5 = mg_dns_encode_name(io,local_40,rlen);
          if (iVar5 == -1) {
            return -1;
          }
          io->buf[off] = (char)((uint)iVar5 >> 8);
          local_42._0_1_ = (char)iVar5;
          io->buf[off + 1] = (char)local_42;
        }
        else {
          local_42 = (ushort)rlen << 8 | (ushort)rlen >> 8;
          mbuf_insert(io,io->len,&local_42,2);
          mbuf_insert(io,io->len,local_40,rlen);
        }
      }
      iVar5 = (int)io->len - (int)sVar3;
    }
  }
  return iVar5;
}

Assistant:

int mg_dns_encode_record(struct mbuf *io, struct mg_dns_resource_record *rr,
                         const char *name, size_t nlen, const void *rdata,
                         size_t rlen) {
    size_t pos = io->len;
    uint16_t u16;
    uint32_t u32;

    if (rr->kind == MG_DNS_INVALID_RECORD) {
        return -1; /* LCOV_EXCL_LINE */
    }

    if (mg_dns_encode_name(io, name, nlen) == -1) {
        return -1;
    }

    u16 = htons(rr->rtype);
    mbuf_append(io, &u16, 2);
    u16 = htons(rr->rclass);
    mbuf_append(io, &u16, 2);

    if (rr->kind == MG_DNS_ANSWER) {
        u32 = htonl(rr->ttl);
        mbuf_append(io, &u32, 4);

        if (rr->rtype == MG_DNS_CNAME_RECORD) {
            int clen;
            /* fill size after encoding */
            size_t off = io->len;
            mbuf_append(io, &u16, 2);
            if ((clen = mg_dns_encode_name(io, (const char *) rdata, rlen)) == -1) {
                return -1;
            }
            u16 = clen;
            io->buf[off] = u16 >> 8;
            io->buf[off + 1] = u16 & 0xff;
        } else {
            u16 = htons(rlen);
            mbuf_append(io, &u16, 2);
            mbuf_append(io, rdata, rlen);
        }
    }

    return io->len - pos;
}